

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

size_t buffer_good_alloc_size(size_t requested_alloc)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  
  if (requested_alloc < 0x101) {
    uVar1 = 0x10;
    do {
      uVar2 = uVar1;
      uVar1 = uVar2 * 2;
    } while (uVar2 < requested_alloc);
  }
  else {
    lVar3 = 0x200;
    do {
      uVar2 = lVar3 - 0x20;
      lVar3 = lVar3 * 2;
    } while (uVar2 < requested_alloc);
  }
  return uVar2;
}

Assistant:

static size_t
buffer_good_alloc_size(size_t requested_alloc)
{
    size_t good_alloc;

    if(requested_alloc <= 256) {
        good_alloc = 16;
        while(good_alloc < requested_alloc)
            good_alloc *= 2;
    } else {
        /* For larger buffers we subtract 32 bytes as the libc heap allocator
         * needs some space for internal bookkeeping, and these would cause
         * that two small blocks cannot fit into a window previously freed
         * from twice as malloc'ed block.
         *
         * (AFAIK, most allocators use 8 or 16 bytes for the purpose, but lets
         * be little bit more conservative.)
         */
        good_alloc = 512;
        while(good_alloc-32 < requested_alloc)
            good_alloc *= 2;
        good_alloc -= 32;
    }

    return good_alloc;
}